

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O2

ssize_t __thiscall AutoFile::write(AutoFile *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  FILE *__s;
  pointer pbVar2;
  size_t key_offset;
  void *pvVar3;
  char *pcVar4;
  ptrdiff_t _Num;
  void *__n_00;
  undefined4 in_register_00000034;
  void *pvVar5;
  long in_FS_OFFSET;
  Span<std::byte> write;
  Span<const_std::byte> key;
  array<std::byte,_4096UL> buf;
  
  pvVar5 = (void *)CONCAT44(in_register_00000034,__fd);
  buf._M_elems[8] = 0;
  buf._M_elems[9] = 0;
  buf._M_elems[10] = 0;
  buf._M_elems[0xb] = 0;
  buf._M_elems[0xc] = 0;
  buf._M_elems[0xd] = 0;
  buf._M_elems[0xe] = 0;
  buf._M_elems[0xf] = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __s = (FILE *)this->m_file;
  if (__s == (FILE *)0x0) {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    buf._M_elems._8_8_ = std::iostream_category();
    buf._M_elems[0] = 1;
    buf._M_elems[1] = 0;
    buf._M_elems[2] = 0;
    buf._M_elems[3] = 0;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar4,(error_code *)"AutoFile::write: file handle is nullptr");
LAB_0063e95d:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    if ((this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar5 = (void *)fwrite(pvVar5,1,(size_t)__buf,__s);
      if (pvVar5 != __buf) {
        pcVar4 = (char *)__cxa_allocate_exception(0x20);
        buf._M_elems._8_8_ = std::iostream_category();
        buf._M_elems[0] = 1;
        buf._M_elems[1] = 0;
        buf._M_elems[2] = 0;
        buf._M_elems[3] = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar4,(error_code *)"AutoFile::write: write failed");
        goto LAB_0063e95d;
      }
    }
    else {
      key_offset = ftell(__s);
      if ((long)key_offset < 0) {
        pcVar4 = (char *)__cxa_allocate_exception(0x20);
        buf._M_elems._8_8_ = std::iostream_category();
        buf._M_elems[0] = 1;
        buf._M_elems[1] = 0;
        buf._M_elems[2] = 0;
        buf._M_elems[3] = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar4,(error_code *)"AutoFile::write: ftell failed");
        goto LAB_0063e95d;
      }
      for (; __buf != (void *)0x0; __buf = (void *)((long)__buf - (long)__n_00)) {
        __n_00 = (void *)0x1000;
        if (__buf < (void *)0x1000) {
          __n_00 = __buf;
        }
        memcpy(&buf,pvVar5,(size_t)__n_00);
        pbVar2 = (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
        key.m_size = (long)(this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
        write.m_size = (size_t)__n_00;
        write.m_data = buf._M_elems;
        key.m_data = pbVar2;
        util::Xor(write,key,key_offset);
        pvVar3 = (void *)fwrite(&buf,1,(size_t)__n_00,(FILE *)this->m_file);
        if (pvVar3 != __n_00) {
          pcVar4 = (char *)__cxa_allocate_exception(0x20);
          std::iostream_category();
          std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)"XorFile::write: failed");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_0063e9cb;
        }
        pvVar5 = (void *)((long)pvVar5 + (long)__n_00);
        key_offset = key_offset + (long)__n_00;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
LAB_0063e9cb:
  __stack_chk_fail();
}

Assistant:

void AutoFile::write(Span<const std::byte> src)
{
    if (!m_file) throw std::ios_base::failure("AutoFile::write: file handle is nullptr");
    if (m_xor.empty()) {
        if (std::fwrite(src.data(), 1, src.size(), m_file) != src.size()) {
            throw std::ios_base::failure("AutoFile::write: write failed");
        }
    } else {
        auto current_pos{std::ftell(m_file)};
        if (current_pos < 0) throw std::ios_base::failure("AutoFile::write: ftell failed");
        std::array<std::byte, 4096> buf;
        while (src.size() > 0) {
            auto buf_now{Span{buf}.first(std::min<size_t>(src.size(), buf.size()))};
            std::copy(src.begin(), src.begin() + buf_now.size(), buf_now.begin());
            util::Xor(buf_now, m_xor, current_pos);
            if (std::fwrite(buf_now.data(), 1, buf_now.size(), m_file) != buf_now.size()) {
                throw std::ios_base::failure{"XorFile::write: failed"};
            }
            src = src.subspan(buf_now.size());
            current_pos += buf_now.size();
        }
    }
}